

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O0

void Int_ManPrintClause(Int_Man_t *p,Sto_Cls_t *pClause)

{
  uint uVar1;
  uint uVar2;
  int local_1c;
  int i;
  Sto_Cls_t *pClause_local;
  Int_Man_t *p_local;
  
  uVar1 = pClause->Id;
  uVar2 = Int_ManProofGet(p,pClause);
  printf("Clause ID = %d. Proof = %d. {",(ulong)uVar1,(ulong)uVar2);
  for (local_1c = 0; local_1c < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff);
      local_1c = local_1c + 1) {
    printf(" %d",(ulong)*(uint *)((long)&pClause[1].pNext + (long)local_1c * 4));
  }
  printf(" }\n");
  return;
}

Assistant:

void Int_ManPrintClause( Int_Man_t * p, Sto_Cls_t * pClause )
{
    int i;
    printf( "Clause ID = %d. Proof = %d. {", pClause->Id, Int_ManProofGet(p, pClause) );
    for ( i = 0; i < (int)pClause->nLits; i++ )
        printf( " %d", pClause->pLits[i] );
    printf( " }\n" );
}